

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int __thiscall s2pred::CompareDistances(s2pred *this,S2Point *x,S2Point *a,S2Point *b)

{
  bool bVar1;
  int iVar2;
  Vector3<ExactFloat> *this_00;
  double dVar3;
  Vector3_xf local_b8;
  Vector3_xf local_88;
  Vector3_xf local_58;
  
  iVar2 = TriageCompareCosDistances<double>((Vector3<double> *)this,x,a);
  if (iVar2 == 0) {
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)x,a);
    iVar2 = 0;
    if (!bVar1) {
      dVar3 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                        ((BasicVector<Vector3,_double,_3UL> *)x,(D *)this);
      if (dVar3 <= 0.7071067811865476) {
        if (-0.7071067811865476 <= dVar3) {
          local_58.c_[0]._0_10_ = (BADTYPE)*(double *)this;
          local_58.c_[1]._0_10_ = (BADTYPE)*(double *)(this + 8);
          local_58.c_[2]._0_10_ = (BADTYPE)*(double *)(this + 0x10);
          local_88.c_[0]._0_10_ = (BADTYPE)x->c_[0];
          local_88.c_[1]._0_10_ = (BADTYPE)x->c_[1];
          local_88.c_[2]._0_10_ = (BADTYPE)x->c_[2];
          local_b8.c_[0]._0_10_ = (BADTYPE)a->c_[0];
          local_b8.c_[1]._0_10_ = (BADTYPE)a->c_[1];
          local_b8.c_[2]._0_10_ = (BADTYPE)a->c_[2];
          iVar2 = TriageCompareCosDistances<long_double>
                            ((s2pred *)&local_58,(Vector3<long_double> *)&local_88,
                             (Vector3<long_double> *)&local_b8,(Vector3<long_double> *)b);
        }
        else {
          iVar2 = CompareSin2Distances(this,x,a,b);
          iVar2 = -iVar2;
        }
      }
      else {
        iVar2 = CompareSin2Distances(this,x,a,b);
      }
      if (iVar2 == 0) {
        util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
        GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                  (&local_58,(BasicVector<Vector3,ExactFloat,3ul> *)this);
        util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
        GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                  (&local_88,(BasicVector<Vector3,ExactFloat,3ul> *)x);
        util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
        GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                  (&local_b8,(BasicVector<Vector3,ExactFloat,3ul> *)a);
        iVar2 = ExactCompareDistances(&local_58,&local_88,&local_b8);
        Vector3<ExactFloat>::~Vector3(&local_b8);
        Vector3<ExactFloat>::~Vector3(&local_88);
        this_00 = &local_58;
        Vector3<ExactFloat>::~Vector3(this_00);
        if (iVar2 == 0) {
          iVar2 = SymbolicCompareDistances((S2Point *)this_00,x,a);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int CompareDistances(const S2Point& x, const S2Point& a, const S2Point& b) {
  // We start by comparing distances using dot products (i.e., cosine of the
  // angle), because (1) this is the cheapest technique, and (2) it is valid
  // over the entire range of possible angles.  (We can only use the sin^2
  // technique if both angles are less than 90 degrees or both angles are
  // greater than 90 degrees.)
  int sign = TriageCompareCosDistances(x, a, b);
  if (sign != 0) return sign;

  // Optimization for (a == b) to avoid falling back to exact arithmetic.
  if (a == b) return 0;

  // It is much better numerically to compare distances using cos(angle) if
  // the distances are near 90 degrees and sin^2(angle) if the distances are
  // near 0 or 180 degrees.  We only need to check one of the two angles when
  // making this decision because the fact that the test above failed means
  // that angles "a" and "b" are very close together.
  double cos_ax = a.DotProd(x);
  if (cos_ax > M_SQRT1_2) {
    // Angles < 45 degrees.
    sign = CompareSin2Distances(x, a, b);
  } else if (cos_ax < -M_SQRT1_2) {
    // Angles > 135 degrees.  sin^2(angle) is decreasing in this range.
    sign = -CompareSin2Distances(x, a, b);
  } else {
    // We've already tried double precision, so continue with "long double".
    sign = TriageCompareCosDistances(ToLD(x), ToLD(a), ToLD(b));
  }
  if (sign != 0) return sign;
  sign = ExactCompareDistances(ToExact(x), ToExact(a), ToExact(b));
  if (sign != 0) return sign;
  return SymbolicCompareDistances(x, a, b);
}